

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::BuildProgram
          (EnableDisableAttributesTest *this,char *vertex_shader,bool bind_even_or_odd)

{
  code *pcVar1;
  GLuint GVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  undefined4 *puVar10;
  string *psVar11;
  undefined8 uVar12;
  GLuint i_00;
  Enum<int,_2UL> EVar13;
  uint local_41c;
  undefined1 local_418 [4];
  GLuint i_3;
  char *local_298;
  GLchar *log_text_1;
  uint local_288;
  GLint log_size_1;
  GLuint i_2;
  GLint status;
  allocator<char> local_259;
  string local_258 [32];
  string local_238 [8];
  string attribute;
  GLint i_1;
  Enum<int,_2UL> local_200;
  MessageBuilder local_1f0;
  char *local_70;
  GLchar *log_text;
  GLint log_size;
  GLint status_1;
  GLuint i;
  GLuint local_50;
  undefined4 local_4c;
  GLuint po;
  GLuint shader_count;
  Shader shader [2];
  Functions *gl;
  bool bind_even_or_odd_local;
  char *vertex_shader_local;
  EnableDisableAttributesTest *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  shader[1]._8_8_ = CONCAT44(extraout_var,iVar3);
  shader[0].source._0_4_ = 0x8b31;
  shader[0].source._4_4_ = 0;
  shader[0]._8_8_ = s_fragment_shader;
  shader[1].source._0_4_ = 0x8b30;
  shader[1].source._4_4_ = 0;
  local_4c = 2;
  local_50 = 0;
  _po = vertex_shader;
  local_50 = (**(code **)(shader[1]._8_8_ + 0x3c8))();
  dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x147);
  for (log_size = 0; (uint)log_size < 2; log_size = log_size + 1) {
    if (*(long *)(&po + (ulong)(uint)log_size * 4) != 0) {
      uVar5 = (**(code **)(shader[1]._8_8_ + 0x3f0))(*(undefined4 *)&shader[(uint)log_size].source);
      *(undefined4 *)((long)&shader[(uint)log_size].source + 4) = uVar5;
      dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar4,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x151);
      (**(code **)(shader[1]._8_8_ + 0x10))
                (local_50,*(undefined4 *)((long)&shader[(uint)log_size].source + 4));
      dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar4,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x155);
      (**(code **)(shader[1]._8_8_ + 0x12b8))
                (*(undefined4 *)((long)&shader[(uint)log_size].source + 4),1,
                 &po + (ulong)(uint)log_size * 4,0);
      dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar4,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x159);
      (**(code **)(shader[1]._8_8_ + 0x248))
                (*(undefined4 *)((long)&shader[(uint)log_size].source + 4));
      dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar4,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x15d);
      log_text._4_4_ = 0;
      (**(code **)(shader[1]._8_8_ + 0xa70))
                (*(undefined4 *)((long)&shader[(uint)log_size].source + 4),0x8b81,
                 (long)&log_text + 4);
      dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar4,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x162);
      if (log_text._4_4_ == 0) {
        log_text._0_4_ = 0;
        (**(code **)(shader[1]._8_8_ + 0xa70))
                  (*(undefined4 *)((long)&shader[(uint)log_size].source + 4),0x8b84,&log_text);
        dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
        glu::checkError(dVar4,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x168);
        local_70 = (char *)operator_new__((long)(int)log_text);
        (**(code **)(shader[1]._8_8_ + 0xa58))
                  (*(undefined4 *)((long)&shader[(uint)log_size].source + 4),(int)log_text,0,
                   local_70);
        pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        tcu::TestLog::operator<<(&local_1f0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_1f0,(char (*) [32])"Shader compilation has failed.\n");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])"Shader type: ");
        EVar13 = glu::getShaderTypeStr(*(int *)&shader[(uint)log_size].source);
        local_200.m_getName = EVar13.m_getName;
        local_200.m_value = EVar13.m_value;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_200);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b9e07b);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [31])"Shader compilation error log:\n");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_70);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b9e07b);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [21])"Shader source code:\n");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char **)(&po + (ulong)(uint)log_size * 4));
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b9e07b);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1f0);
        if (local_70 != (char *)0x0) {
          operator_delete__(local_70);
        }
        dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
        glu::checkError(dVar4,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                        ,0x179);
        puVar10 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar10 = 0;
        __cxa_throw(puVar10,&int::typeinfo,0);
      }
    }
  }
  (**(code **)(shader[1]._8_8_ + 0x14c8))(local_50,1,&BuildProgram::xfb_varying,0x8c8c);
  dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x184);
  for (attribute.field_2._12_4_ = ZEXT14(bind_even_or_odd);
      (int)attribute.field_2._12_4_ < this->m_max_attributes;
      attribute.field_2._12_4_ = attribute.field_2._12_4_ + 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_258,"a_",&local_259);
    Utilities::itoa_abi_cxx11_
              ((string *)&i_2,(Utilities *)(ulong)(uint)attribute.field_2._12_4_,i_00);
    psVar11 = (string *)std::__cxx11::string::append(local_258);
    std::__cxx11::string::string(local_238,psVar11);
    std::__cxx11::string::~string((string *)&i_2);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator(&local_259);
    GVar2 = local_50;
    uVar5 = attribute.field_2._12_4_;
    pcVar1 = *(code **)(shader[1]._8_8_ + 0x38);
    uVar12 = std::__cxx11::string::c_str();
    (*pcVar1)(GVar2,uVar5,uVar12);
    dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
    glu::checkError(dVar4,"glBindAttribLocation call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x18b);
    std::__cxx11::string::~string(local_238);
  }
  (**(code **)(shader[1]._8_8_ + 0xce8))(local_50);
  dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x191);
  log_size_1 = 0;
  (**(code **)(shader[1]._8_8_ + 0x9d8))(local_50,0x8b82,&log_size_1);
  if (log_size_1 != 1) {
    log_text_1._4_4_ = 0;
    (**(code **)(shader[1]._8_8_ + 0x9d8))(local_50,0x8b84,(long)&log_text_1 + 4);
    dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
    glu::checkError(dVar4,"glGetProgramiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x1a9);
    local_298 = (char *)operator_new__((long)log_text_1._4_4_);
    (**(code **)(shader[1]._8_8_ + 0x988))(local_50,log_text_1._4_4_,0,local_298);
    pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar8 = tcu::TestContext::getLog(pTVar7);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_418,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_418,
                        (char (*) [36])"Program linkage has failed due to:\n");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_298);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b9e07b);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_418);
    if (local_298 != (char *)0x0) {
      operator_delete__(local_298);
    }
    dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
    glu::checkError(dVar4,"glGetProgramInfoLog call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x1b5);
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  for (local_288 = 0; local_288 < 2; local_288 = local_288 + 1) {
    if (*(int *)((long)&shader[local_288].source + 4) != 0) {
      (**(code **)(shader[1]._8_8_ + 0x4e0))
                (local_50,*(undefined4 *)((long)&shader[local_288].source + 4));
      dVar4 = (**(code **)(shader[1]._8_8_ + 0x800))();
      glu::checkError(dVar4,"glDetachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x19f);
    }
  }
  for (local_41c = 0; local_41c < 2; local_41c = local_41c + 1) {
    if (*(int *)((long)&shader[local_41c].source + 4) != 0) {
      (**(code **)(shader[1]._8_8_ + 0x470))(*(undefined4 *)((long)&shader[local_41c].source + 4));
      *(undefined4 *)((long)&shader[local_41c].source + 4) = 0;
    }
  }
  if (local_50 != 0) {
    return local_50;
  }
  puVar10 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar10 = 0;
  __cxa_throw(puVar10,&int::typeinfo,0);
}

Assistant:

glw::GLuint EnableDisableAttributesTest::BuildProgram(const char* vertex_shader, const bool bind_even_or_odd)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	glw::GLuint po = 0;

	try
	{
		/* Create program. */
		po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
														<< "Shader type: " << glu::getShaderTypeStr(shader[i].type)
														<< "\n"
														<< "Shader compilation error log:\n"
														<< log_text << "\n"
														<< "Shader source code:\n"
														<< shader[i].source << "\n"
														<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Transform Feedback setup. */
		static const glw::GLchar* xfb_varying = "sum";

		gl.transformFeedbackVaryings(po, 1, &xfb_varying, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		for (glw::GLint i = (glw::GLint)(bind_even_or_odd); i < m_max_attributes; i += 2)
		{
			std::string attribute = std::string("a_").append(Utilities::itoa(i));

			gl.bindAttribLocation(po, i, attribute.c_str());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindAttribLocation call failed.");
		}

		/* Link. */
		gl.linkProgram(po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (po)
		{
			gl.deleteProgram(po);

			po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == po)
	{
		throw 0;
	}

	return po;
}